

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O2

void symmetry_transform(loc_conflict *grid,wchar_t y0,wchar_t x0,wchar_t height,wchar_t width,
                       wchar_t rotate,_Bool reflect)

{
  uint uVar1;
  wchar_t rheight;
  wchar_t rwidth;
  wchar_t wVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0;
  if (0 < (int)((long)rotate % 4)) {
    uVar5 = (long)rotate % 4 & 0xffffffff;
  }
  uVar1 = grid->x;
  while( true ) {
    wVar2 = width;
    iVar4 = (int)uVar5;
    uVar5 = (ulong)(iVar4 - 1);
    if (iVar4 == 0) break;
    uVar3 = ~grid->y + height;
    grid->x = uVar3;
    grid->y = uVar1;
    uVar1 = uVar3;
    width = height;
    height = wVar2;
  }
  uVar3 = wVar2 + ~uVar1;
  if (!reflect) {
    uVar3 = uVar1;
  }
  grid->y = grid->y + y0;
  grid->x = uVar3 + x0;
  return;
}

Assistant:

void symmetry_transform(struct loc *grid, int y0, int x0, int height, int width,
						int rotate, bool reflect)
{
	/* Track what the dimensions are after rotations. */
	int rheight = height, rwidth = width;
	int i;

	/* Rotate (in multiples of 90 degrees clockwise) */
	for (i = 0; i < rotate % 4; i++) {
		int temp = grid->x;
		grid->x = rheight - 1 - (grid->y);
		grid->y = temp;
		temp = rwidth;
		rwidth = rheight;
		rheight = temp;
	}

	/* Reflect (horizontally in the rotated system) */
	if (reflect)
		grid->x = rwidth - 1 - grid->x;

	/* Translate */
	grid->y += y0;
	grid->x += x0;
}